

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O3

int getEndSurfaceHeight(int mc,uint64_t seed,int x,int z)

{
  int iVar1;
  int z_00;
  double ncol10 [33];
  double ncol01 [33];
  double ncol00 [33];
  double ncol11 [33];
  EndNoise en;
  SurfaceNoise sn;
  double local_5128 [34];
  double local_5018 [34];
  double local_4f08 [34];
  double local_4df8 [34];
  EndNoise local_4ce8;
  SurfaceNoise local_4ba0;
  
  setEndSeed(&local_4ce8,mc,seed);
  initSurfaceNoise(&local_4ba0,1,seed);
  iVar1 = x >> 3;
  z_00 = z >> 3;
  sampleNoiseColumnEnd(local_4f08,&local_4ba0,&local_4ce8,iVar1,z_00,0,0x20);
  sampleNoiseColumnEnd(local_5018,&local_4ba0,&local_4ce8,iVar1,z_00 + 1,0,0x20);
  sampleNoiseColumnEnd(local_5128,&local_4ba0,&local_4ce8,iVar1 + 1,z_00,0,0x20);
  sampleNoiseColumnEnd(local_4df8,&local_4ba0,&local_4ce8,iVar1 + 1,z_00 + 1,0,0x20);
  iVar1 = getSurfaceHeight(local_4f08,local_5018,local_5128,local_4df8,0,0x20,4,
                           (double)(x & 7) * 0.125,(double)(z & 7) * 0.125);
  return iVar1;
}

Assistant:

int getEndSurfaceHeight(int mc, uint64_t seed, int x, int z)
{
    EndNoise en;
    setEndSeed(&en, mc, seed);

    SurfaceNoise sn;
    initSurfaceNoise(&sn, DIM_END, seed);

    // end noise columns vary on a grid of cell size = eight
    int cellx = (x >> 3);
    int cellz = (z >> 3);
    double dx = (x & 7) / 8.0;
    double dz = (z & 7) / 8.0;

    // abusing enum for local compile time constants rather than enumeration
    enum { y0 = 0, y1 = 32, yn = y1-y0+1 };
    double ncol00[yn];
    double ncol01[yn];
    double ncol10[yn];
    double ncol11[yn];
    sampleNoiseColumnEnd(ncol00, &sn, &en, cellx, cellz, y0, y1);
    sampleNoiseColumnEnd(ncol01, &sn, &en, cellx, cellz+1, y0, y1);
    sampleNoiseColumnEnd(ncol10, &sn, &en, cellx+1, cellz, y0, y1);
    sampleNoiseColumnEnd(ncol11, &sn, &en, cellx+1, cellz+1, y0, y1);

    return getSurfaceHeight(ncol00, ncol01, ncol10, ncol11, y0, y1, 4, dx, dz);
}